

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O2

void * LZ4_createHC(char *inputBuffer)

{
  LZ4_streamHC_t *hc4;
  
  hc4 = LZ4_createStreamHC();
  if (hc4 != (LZ4_streamHC_t *)0x0) {
    LZ4HC_init_internal(&hc4->internal_donotuse,(BYTE *)inputBuffer);
  }
  return hc4;
}

Assistant:

void* LZ4_createHC (const char* inputBuffer)
{
    LZ4_streamHC_t* const hc4 = LZ4_createStreamHC();
    if (hc4 == NULL) return NULL;   /* not enough memory */
    LZ4HC_init_internal (&hc4->internal_donotuse, (const BYTE*)inputBuffer);
    return hc4;
}